

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O1

CallbackInfo * __thiscall
JITTimeProfileInfo::FindCallbackInfo(JITTimeProfileInfo *this,ProfileId callSiteId)

{
  CallbackInfoIDL *pCVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->m_profileData).profiledCallbackCount;
  if (uVar2 == 0) {
    return (CallbackInfo *)0x0;
  }
  pCVar1 = (this->m_profileData).callbackData;
  do {
    if (pCVar1->struct_pad_1 == callSiteId) {
      return (CallbackInfo *)pCVar1;
    }
    pCVar1 = pCVar1 + 1;
    uVar2 = uVar2 - 1;
  } while (uVar2 != 0);
  return (CallbackInfo *)0x0;
}

Assistant:

Js::CallbackInfo * 
JITTimeProfileInfo::FindCallbackInfo(Js::ProfileId callSiteId) const
{
    Js::CallbackInfo * callbackInfo = GetCallbackInfo();
    for (size_t i = 0; i < m_profileData.profiledCallbackCount; ++i)
    {
        if (callbackInfo[i].callSiteId == callSiteId)
        {
            return &callbackInfo[i];
        }
    }
    return nullptr;
}